

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parameter.hpp
# Opt level: O0

void __thiscall
boost::runtime::enum_parameter<boost::unit_test::output_format,_(boost::runtime::args_amount)0>::
value_help(enum_parameter<boost::unit_test::output_format,_(boost::runtime::args_amount)0> *this,
          ostream *ostr)

{
  static_any_base *psVar1;
  static_any_base *psVar2;
  bool bVar3;
  ulong uVar4;
  ostream *in_RSI;
  long in_RDI;
  cstring name;
  bool _fe_con_400;
  static_any_t _fe_end_400;
  static_any_t _fe_cur_400;
  bool first;
  basic_cstring<const_char> *in_stack_ffffffffffffffa8;
  basic_ostream<char,_std::char_traits<char>_> *in_stack_ffffffffffffffb0;
  __normal_iterator<const_boost::unit_test::basic_cstring<const_char>_*,_std::vector<boost::unit_test::basic_cstring<const_char>,_std::allocator<boost::unit_test::basic_cstring<const_char>_>_>_>
  local_40;
  static_any_base *local_38;
  __normal_iterator<const_boost::unit_test::basic_cstring<const_char>_*,_std::vector<boost::unit_test::basic_cstring<const_char>,_std::allocator<boost::unit_test::basic_cstring<const_char>_>_>_>
  local_28;
  static_any_base *local_20;
  byte local_11;
  ostream *local_10;
  
  local_10 = in_RSI;
  uVar4 = std::__cxx11::string::empty();
  if ((uVar4 & 1) == 0) {
    std::operator<<(local_10,(string *)(in_RDI + 0x88));
  }
  else {
    std::operator<<(local_10,"<");
    local_11 = 1;
    unit_test::for_each::
    is_const_coll<std::vector<boost::unit_test::basic_cstring<char_const>,std::allocator<boost::unit_test::basic_cstring<char_const>>>const>
              ((vector<boost::unit_test::basic_cstring<const_char>,_std::allocator<boost::unit_test::basic_cstring<const_char>_>_>
                *)(in_RDI + 0x120));
    integral_constant::operator_cast_to_bool__((integral_constant<bool,_true> *)0x269f71);
    local_28._M_current =
         (basic_cstring<const_char> *)
         unit_test::for_each::
         begin<std::vector<boost::unit_test::basic_cstring<char_const>,std::allocator<boost::unit_test::basic_cstring<char_const>>>>
                   (in_RDI + 0x120);
    local_20 = (static_any_base *)&local_28;
    bVar3 = unit_test::for_each::static_any_base::operator_cast_to_bool(local_20);
    if (!bVar3) {
      unit_test::for_each::
      is_const_coll<std::vector<boost::unit_test::basic_cstring<char_const>,std::allocator<boost::unit_test::basic_cstring<char_const>>>const>
                ((vector<boost::unit_test::basic_cstring<const_char>,_std::allocator<boost::unit_test::basic_cstring<const_char>_>_>
                  *)(in_RDI + 0x120));
      integral_constant::operator_cast_to_bool__((integral_constant<bool,_true> *)0x269fd4);
      local_40._M_current =
           (basic_cstring<const_char> *)
           unit_test::for_each::
           end<std::vector<boost::unit_test::basic_cstring<char_const>,std::allocator<boost::unit_test::basic_cstring<char_const>>>>
                     (in_RDI + 0x120);
      local_38 = (static_any_base *)&local_40;
      bVar3 = unit_test::for_each::static_any_base::operator_cast_to_bool(local_38);
      if (!bVar3) {
        while( true ) {
          psVar2 = local_20;
          psVar1 = local_38;
          unit_test::for_each::
          is_const_coll<std::vector<boost::unit_test::basic_cstring<char_const>,std::allocator<boost::unit_test::basic_cstring<char_const>>>const>
                    ((vector<boost::unit_test::basic_cstring<const_char>,_std::allocator<boost::unit_test::basic_cstring<const_char>_>_>
                      *)(in_RDI + 0x120));
          integral_constant::operator_cast_to_bool__((integral_constant<bool,_true> *)0x26a05d);
          bVar3 = unit_test::for_each::
                  done<std::vector<boost::unit_test::basic_cstring<char_const>,std::allocator<boost::unit_test::basic_cstring<char_const>>>>
                            (psVar2,psVar1,in_RDI + 0x120);
          psVar1 = local_20;
          if (((bVar3 ^ 0xffU) & 1) == 0) break;
          unit_test::for_each::
          is_const_coll<std::vector<boost::unit_test::basic_cstring<char_const>,std::allocator<boost::unit_test::basic_cstring<char_const>>>const>
                    ((vector<boost::unit_test::basic_cstring<const_char>,_std::allocator<boost::unit_test::basic_cstring<const_char>_>_>
                      *)(in_RDI + 0x120));
          integral_constant::operator_cast_to_bool__((integral_constant<bool,_true> *)0x26a0cc);
          unit_test::for_each::
          deref<boost::unit_test::basic_cstring<char_const>,std::vector<boost::unit_test::basic_cstring<char_const>,std::allocator<boost::unit_test::basic_cstring<char_const>>>>
                    (&stack0xffffffffffffffa8,psVar1,in_RDI + 0x120);
          bVar3 = false;
          while (psVar1 = local_20, !bVar3) {
            if ((local_11 & 1) == 0) {
              std::operator<<(local_10,'|');
            }
            else {
              local_11 = 0;
            }
            unit_test::operator<<(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
            bVar3 = true;
          }
          unit_test::for_each::
          is_const_coll<std::vector<boost::unit_test::basic_cstring<char_const>,std::allocator<boost::unit_test::basic_cstring<char_const>>>const>
                    ((vector<boost::unit_test::basic_cstring<const_char>,_std::allocator<boost::unit_test::basic_cstring<const_char>_>_>
                      *)(in_RDI + 0x120));
          integral_constant::operator_cast_to_bool__((integral_constant<bool,_true> *)0x26a16b);
          unit_test::for_each::
          next<std::vector<boost::unit_test::basic_cstring<char_const>,std::allocator<boost::unit_test::basic_cstring<char_const>>>>
                    (psVar1,in_RDI + 0x120);
        }
      }
    }
    std::operator<<(local_10,">");
  }
  return;
}

Assistant:

virtual void    value_help( std::ostream& ostr ) const
    {
        if( this->p_value_hint.empty() ) {
            ostr << "<";
            bool first = true;
            BOOST_TEST_FOREACH( cstring, name, m_valid_names ) {
                if( first )
                    first = false;
                else
                    ostr << '|';
                ostr << name;
            }
            ostr << ">";
        }
        else
            ostr << this->p_value_hint;
    }